

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsonrpc_test.cpp
# Opt level: O0

void __thiscall json_service::check_method(json_service *this,method_type *m,string *s)

{
  function<void_(const_std::vector<cppcms::json::value,_std::allocator<cppcms::json::value>_>_&)>
  *this_00;
  undefined8 in_RDX;
  vector<cppcms::json::value,_std::allocator<cppcms::json::value>_> *in_RSI;
  value v;
  istringstream ss;
  value local_1a0;
  istringstream local_198 [392];
  vector<cppcms::json::value,_std::allocator<cppcms::json::value>_> *local_10;
  
  local_10 = in_RSI;
  std::__cxx11::istringstream::istringstream(local_198,in_RDX,8);
  cppcms::json::value::value((value *)0x11e1c5);
  cppcms::json::operator>>((istream *)local_198,&local_1a0);
  this_00 = (function<void_(const_std::vector<cppcms::json::value,_std::allocator<cppcms::json::value>_>_&)>
             *)cppcms::json::value::array();
  std::
  function<void_(const_std::vector<cppcms::json::value,_std::allocator<cppcms::json::value>_>_&)>::
  operator()(this_00,local_10);
  cppcms::json::value::~value((value *)0x11e20f);
  std::__cxx11::istringstream::~istringstream(local_198);
  return;
}

Assistant:

void check_method(method_type const &m,std::string s)
	{
		std::istringstream ss(s);
		cppcms::json::value v;
		ss >> v;
		m(v.array());
	}